

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singlylinkedlist.c
# Opt level: O3

void * singlylinkedlist_item_get_value(LIST_ITEM_HANDLE item_handle)

{
  LOGGER_LOG p_Var1;
  void *pvVar2;
  
  if (item_handle == (LIST_ITEM_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      pvVar2 = (void *)0x0;
    }
    else {
      pvVar2 = (void *)0x0;
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/singlylinkedlist.c"
                ,"singlylinkedlist_item_get_value",0xd5,1,"Invalid argument (item_handle is NULL)");
    }
  }
  else {
    pvVar2 = item_handle->item;
  }
  return pvVar2;
}

Assistant:

const void* singlylinkedlist_item_get_value(LIST_ITEM_HANDLE item_handle)
{
    const void* result;

    if (item_handle == NULL)
    {
        LogError("Invalid argument (item_handle is NULL)");
        /* Codes_SRS_LIST_01_021: [If item_handle is NULL, singlylinkedlist_item_get_value shall return NULL.] */
        result = NULL;
    }
    else
    {
        /* Codes_SRS_LIST_01_020: [singlylinkedlist_item_get_value shall return the value associated with the list item identified by the item_handle argument.] */
        result = ((LIST_ITEM_INSTANCE*)item_handle)->item;
    }

    return result;
}